

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int mtree_entry_exchange_same_entry
              (archive_write *a,mtree_entry_conflict *np,mtree_entry_conflict *file)

{
  archive_string *in_RDX;
  long in_RSI;
  archive *in_RDI;
  archive_string *in_stack_ffffffffffffffd8;
  int local_4;
  
  if ((*(uint *)(in_RSI + 0xe8) & 0xf000) == ((uint)in_RDX[9].buffer_length & 0xf000)) {
    *(undefined8 *)(in_RSI + 0x88) = 0;
    archive_string_concat(in_RDX,in_stack_ffffffffffffffd8);
    *(undefined8 *)(in_RSI + 0xa0) = 0;
    archive_string_concat(in_RDX,in_stack_ffffffffffffffd8);
    *(undefined8 *)(in_RSI + 0xb8) = 0;
    archive_string_concat(in_RDX,in_stack_ffffffffffffffd8);
    *(undefined8 *)(in_RSI + 0xd0) = 0;
    archive_string_concat(in_RDX,in_stack_ffffffffffffffd8);
    *(int *)(in_RSI + 0xe0) = (int)in_RDX[9].length;
    *(undefined4 *)(in_RSI + 0xe4) = *(undefined4 *)((long)&in_RDX[9].length + 4);
    *(int *)(in_RSI + 0xe8) = (int)in_RDX[9].buffer_length;
    *(char **)(in_RSI + 0xf0) = in_RDX[10].s;
    *(size_t *)(in_RSI + 0xf8) = in_RDX[10].length;
    *(size_t *)(in_RSI + 0x100) = in_RDX[10].buffer_length;
    *(size_t *)(in_RSI + 0x118) = in_RDX[0xb].buffer_length;
    *(char **)(in_RSI + 0x120) = in_RDX[0xc].s;
    *(char **)(in_RSI + 0x108) = in_RDX[0xb].s;
    *(size_t *)(in_RSI + 0x110) = in_RDX[0xb].length;
    *(size_t *)(in_RSI + 0x128) = in_RDX[0xc].length;
    *(size_t *)(in_RSI + 0x130) = in_RDX[0xc].buffer_length;
    *(char **)(in_RSI + 0x138) = in_RDX[0xd].s;
    *(size_t *)(in_RSI + 0x140) = in_RDX[0xd].length;
    *(size_t *)(in_RSI + 0x148) = in_RDX[0xd].buffer_length;
    local_4 = -0x14;
  }
  else {
    archive_set_error(in_RDI,-1,"Found duplicate entries `%s\' and its file type is different",
                      *(undefined8 *)(in_RSI + 0x68));
    local_4 = -0x19;
  }
  return local_4;
}

Assistant:

static int
mtree_entry_exchange_same_entry(struct archive_write *a, struct mtree_entry *np,
    struct mtree_entry *file)
{

	if ((np->mode & AE_IFMT) != (file->mode & AE_IFMT)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Found duplicate entries `%s' and its file type is "
		    "different",
		    np->pathname.s);
		return (ARCHIVE_FAILED);
	}

	/* Update the existent mtree entry's attributes by the new one's. */
	archive_string_empty(&np->symlink);
	archive_string_concat(&np->symlink, &file->symlink);
	archive_string_empty(&np->uname);
	archive_string_concat(&np->uname, &file->uname);
	archive_string_empty(&np->gname);
	archive_string_concat(&np->gname, &file->gname);
	archive_string_empty(&np->fflags_text);
	archive_string_concat(&np->fflags_text, &file->fflags_text);
	np->nlink = file->nlink;
	np->filetype = file->filetype;
	np->mode = file->mode;
	np->size = file->size;
	np->uid = file->uid;
	np->gid = file->gid;
	np->fflags_set = file->fflags_set;
	np->fflags_clear = file->fflags_clear;
	np->mtime = file->mtime;
	np->mtime_nsec = file->mtime_nsec;
	np->rdevmajor = file->rdevmajor;
	np->rdevminor = file->rdevminor;
	np->devmajor = file->devmajor;
	np->devminor = file->devminor;
	np->ino = file->ino;

	return (ARCHIVE_WARN);
}